

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O0

void anon_unknown.dwarf_217a65::compareImages(char *fileName1,char *fileName2)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Rgba *pRVar4;
  long lVar5;
  char *in_RSI;
  char *in_RDI;
  float fVar6;
  float fVar7;
  int i;
  Array<Imf_3_4::Rgba> pixels2;
  Array<Imf_3_4::Rgba> pixels1;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in2;
  RgbaInputFile in1;
  undefined4 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  long in_stack_fffffffffffffee8;
  Array<Imf_3_4::Rgba> *in_stack_fffffffffffffef0;
  int local_dc;
  Array local_d8 [16];
  Array local_c8 [16];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int *local_a8;
  Rgba local_90 [8];
  Rgba local_50 [8];
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"comparing files ");
  poVar3 = std::operator<<(poVar3,local_8);
  poVar3 = std::operator<<(poVar3," and ");
  poVar3 = std::operator<<(poVar3,local_10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_50,local_8,iVar2);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_90,local_10,iVar2);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (!bVar1) {
    __assert_fail("in1.dataWindow () == in2.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                  ,0x4d,"void (anonymous namespace)::compareImages(const char *, const char *)");
  }
  local_a8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  local_ac = (local_a8[2] - *local_a8) + 1;
  local_b0 = (local_a8[3] - local_a8[1]) + 1;
  local_b4 = *local_a8;
  local_b8 = local_a8[1];
  Imf_3_4::Array<Imf_3_4::Rgba>::Array(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Imf_3_4::Array<Imf_3_4::Rgba>::Array(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pRVar4 = Imf_3_4::Array::operator_cast_to_Rgba_(local_c8);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_50,(ulong)(pRVar4 + (-(long)local_b4 - (long)(local_b8 * local_ac))),1);
  pRVar4 = Imf_3_4::Array::operator_cast_to_Rgba_(local_d8);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_90,(ulong)(pRVar4 + (-(long)local_b4 - (long)(local_b8 * local_ac))),1);
  lVar5 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar2 = *(int *)(lVar5 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)local_50,iVar2);
  lVar5 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar2 = *(int *)(lVar5 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)local_90,iVar2);
  local_dc = 0;
  while( true ) {
    if (local_ac * local_b0 <= local_dc) {
      Imf_3_4::Array<Imf_3_4::Rgba>::~Array
                ((Array<Imf_3_4::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      Imf_3_4::Array<Imf_3_4::Rgba>::~Array
                ((Array<Imf_3_4::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_90);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_50);
      return;
    }
    Imf_3_4::Array::operator_cast_to_Rgba_(local_c8);
    fVar6 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    Imf_3_4::Array::operator_cast_to_Rgba_(local_d8);
    fVar7 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = approximatelyEqual(fVar6,fVar7);
    if (!bVar1) {
      __assert_fail("approximatelyEqual (pixels1[i].r, pixels2[i].r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                    ,0x61,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    Imf_3_4::Array::operator_cast_to_Rgba_(local_c8);
    fVar6 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    Imf_3_4::Array::operator_cast_to_Rgba_(local_d8);
    fVar7 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = approximatelyEqual(fVar6,fVar7);
    if (!bVar1) {
      __assert_fail("approximatelyEqual (pixels1[i].g, pixels2[i].g)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                    ,0x62,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    Imf_3_4::Array::operator_cast_to_Rgba_(local_c8);
    in_stack_fffffffffffffeb4 =
         Imath_3_2::half::operator_cast_to_float
                   ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    Imf_3_4::Array::operator_cast_to_Rgba_(local_d8);
    fVar6 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = approximatelyEqual(in_stack_fffffffffffffeb4,fVar6);
    if (!bVar1) break;
    Imf_3_4::Array::operator_cast_to_Rgba_(local_c8);
    fVar6 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    Imf_3_4::Array::operator_cast_to_Rgba_(local_d8);
    fVar7 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = approximatelyEqual(fVar6,fVar7);
    in_stack_fffffffffffffeb0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb0);
    if (!bVar1) {
      __assert_fail("approximatelyEqual (pixels1[i].a, pixels2[i].a)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                    ,100,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    local_dc = local_dc + 1;
  }
  __assert_fail("approximatelyEqual (pixels1[i].b, pixels2[i].b)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                ,99,"void (anonymous namespace)::compareImages(const char *, const char *)");
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName2);

    assert (in1.dataWindow () == in2.dataWindow ());

    const Box2i& dw = in1.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow ().min.y, in1.dataWindow ().max.y);
    in2.readPixels (in2.dataWindow ().min.y, in2.dataWindow ().max.y);

    for (int i = 0; i < w * h; ++i)
    {
        assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
        assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
        assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
        assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}